

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::EscapeForCMake_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,
          WrapQuotes wrapQuotes)

{
  char cVar1;
  char *pcVar2;
  undefined4 in_EAX;
  cmOutputConverter *pcVar3;
  undefined4 uStack_38;
  int local_34;
  
  _uStack_38 = CONCAT44((int)str._M_str,in_EAX);
  pcVar2 = "PK\x01\x02";
  if ((int)str._M_str == 0) {
    pcVar2 = "\n\t\t\t\"";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2 + 4,(allocator<char> *)((long)&uStack_38 + 3));
  for (pcVar3 = (cmOutputConverter *)0x0; this != pcVar3;
      pcVar3 = (cmOutputConverter *)((long)&pcVar3->_vptr_cmOutputConverter + 1)) {
    cVar1 = *(char *)((long)&pcVar3->_vptr_cmOutputConverter + str._M_len);
    if (((cVar1 == '\\') || (cVar1 == '$')) || (cVar1 == '\"')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  if (local_34 == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForCMake(cm::string_view str,
                                              WrapQuotes wrapQuotes)
{
  // Always double-quote the argument to take care of most escapes.
  std::string result = (wrapQuotes == WrapQuotes::Wrap) ? "\"" : "";
  for (const char c : str) {
    if (c == '"') {
      // Escape the double quote to avoid ending the argument.
      result += "\\\"";
    } else if (c == '$') {
      // Escape the dollar to avoid expanding variables.
      result += "\\$";
    } else if (c == '\\') {
      // Escape the backslash to avoid other escapes.
      result += "\\\\";
    } else {
      // Other characters will be parsed correctly.
      result += c;
    }
  }
  if (wrapQuotes == WrapQuotes::Wrap) {
    result += "\"";
  }
  return result;
}